

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

OnCallSpec<test_result_(long_long)> * __thiscall
testing::internal::MockSpec<test_result_(long_long)>::InternalDefaultActionSetAt
          (MockSpec<test_result_(long_long)> *this,char *file,int line,char *obj,char *call)

{
  OnCallSpec<test_result_(long_long)> *pOVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  string *in_stack_000000d8;
  ArgumentMatcherTuple *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  FunctionMockerBase<test_result_(long_long)> *in_stack_ffffffffffffff40;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [72];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff38,"ON_CALL(",(allocator *)&stack0xffffffffffffff37);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_RSI,in_RDI);
  LogWithLocation(line,obj,call._4_4_,in_stack_000000d8);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  pOVar1 = FunctionMockerBase<test_result_(long_long)>::AddNewOnCallSpec
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                      in_stack_ffffffffffffff28);
  return pOVar1;
}

Assistant:

internal::OnCallSpec<F>& InternalDefaultActionSetAt(
      const char* file, int line, const char* obj, const char* call) {
    LogWithLocation(internal::kInfo, file, line,
        string("ON_CALL(") + obj + ", " + call + ") invoked");
    return function_mocker_->AddNewOnCallSpec(file, line, matchers_);
  }